

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureBorderClampSamplerParameterIWithWrongPname.cpp
# Opt level: O0

void __thiscall
glcts::TextureBorderClampSamplerParameterIWithWrongPnameTest::initTest
          (TextureBorderClampSamplerParameterIWithWrongPnameTest *this)

{
  int iVar1;
  deUint32 dVar2;
  NotSupportedError *this_00;
  RenderContext *pRVar3;
  undefined4 extraout_var;
  value_type_conflict4 local_44 [7];
  long local_28;
  Functions *gl;
  TextureBorderClampSamplerParameterIWithWrongPnameTest *local_10;
  TextureBorderClampSamplerParameterIWithWrongPnameTest *this_local;
  
  local_10 = this;
  if (((this->super_TextureBorderClampBase).super_TestCaseBase.m_is_texture_border_clamp_supported &
      1U) == 0) {
    this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    tcu::NotSupportedError::NotSupportedError
              (this_00,"Texture border clamp functionality not supported, skipping","",
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_border_clamp/esextcTextureBorderClampSamplerParameterIWithWrongPname.cpp"
               ,0x5b);
    __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,tcu::NotSupportedError::~NotSupportedError
               );
  }
  pRVar3 = deqp::Context::getRenderContext
                     ((this->super_TextureBorderClampBase).super_TestCaseBase.m_context);
  iVar1 = (*pRVar3->_vptr_RenderContext[3])();
  local_28 = CONCAT44(extraout_var,iVar1);
  (**(code **)(local_28 + 0x6f0))(1,&this->m_sampler_id);
  dVar2 = (**(code **)(local_28 + 0x800))();
  glu::checkError(dVar2,"Error generating sampler object",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_border_clamp/esextcTextureBorderClampSamplerParameterIWithWrongPname.cpp"
                  ,99);
  (**(code **)(local_28 + 0xa8))(0,this->m_sampler_id);
  dVar2 = (**(code **)(local_28 + 0x800))();
  glu::checkError(dVar2,"Error binding sampler object",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_border_clamp/esextcTextureBorderClampSamplerParameterIWithWrongPname.cpp"
                  ,0x67);
  local_44[6] = 0x813c;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
            (&this->m_pnames_list,local_44 + 6);
  local_44[5] = 0x912f;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
            (&this->m_pnames_list,local_44 + 5);
  local_44[4] = 0x813d;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
            (&this->m_pnames_list,local_44 + 4);
  local_44[3] = 0x8e42;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
            (&this->m_pnames_list,local_44 + 3);
  local_44[2] = 0x8e43;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
            (&this->m_pnames_list,local_44 + 2);
  local_44[1] = 0x8e44;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
            (&this->m_pnames_list,local_44 + 1);
  local_44[0] = 0x8e45;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back(&this->m_pnames_list,local_44)
  ;
  return;
}

Assistant:

void TextureBorderClampSamplerParameterIWithWrongPnameTest::initTest(void)
{
	/* Check if EXT_texture_border_clamp is supported */
	if (!m_is_texture_border_clamp_supported)
	{
		throw tcu::NotSupportedError(TEXTURE_BORDER_CLAMP_NOT_SUPPORTED, "", __FILE__, __LINE__);
	}

	/* Retrieve ES entry-points */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Generate a sampler object */
	gl.genSamplers(1, &m_sampler_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error generating sampler object");

	/* Bind the sampler object to a texture unit */
	gl.bindSampler(m_texture_unit_index, m_sampler_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error binding sampler object");

	/* Store all enums that should generate GL_INVALID_ENUM error when used
	 * as parameter names for glGetSamplerParameterI*() and glSamplerParameterI*()
	 * calls.
	 */
	m_pnames_list.push_back(GL_TEXTURE_BASE_LEVEL);
	m_pnames_list.push_back(GL_TEXTURE_IMMUTABLE_FORMAT);
	m_pnames_list.push_back(GL_TEXTURE_MAX_LEVEL);
	m_pnames_list.push_back(GL_TEXTURE_SWIZZLE_R);
	m_pnames_list.push_back(GL_TEXTURE_SWIZZLE_G);
	m_pnames_list.push_back(GL_TEXTURE_SWIZZLE_B);
	m_pnames_list.push_back(GL_TEXTURE_SWIZZLE_A);
}